

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void ThreadHTTP(event_base *base)

{
  bool bVar1;
  Logger *pLVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"http","");
  util::ThreadRename(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar2,HTTP,Debug);
  if (bVar1) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "ThreadHTTP";
    logging_function._M_len = 10;
    LogPrintf_<>(logging_function,source_file,0x15f,HTTP,Debug,"Entering http event loop\n");
  }
  event_base_dispatch(base);
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar2,HTTP,Debug);
  if (bVar1) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "ThreadHTTP";
    logging_function_00._M_len = 10;
    LogPrintf_<>(logging_function_00,source_file_00,0x162,HTTP,Debug,"Exited http event loop\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ThreadHTTP(struct event_base* base)
{
    util::ThreadRename("http");
    LogDebug(BCLog::HTTP, "Entering http event loop\n");
    event_base_dispatch(base);
    // Event loop will be interrupted by InterruptHTTPServer()
    LogDebug(BCLog::HTTP, "Exited http event loop\n");
}